

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
cornerstone::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer prVar5;
  element_type *peVar6;
  ulong uVar7;
  byte in_DL;
  lock_guard<std::recursive_mutex> guard;
  mutex_type *in_stack_fffffffffffffe18;
  strfmt<200> *in_stack_fffffffffffffe20;
  ulong in_stack_fffffffffffffe30;
  element_type *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  strfmt<200> *this_00;
  allocator<char> local_179;
  string local_178 [47];
  allocator<char> local_149;
  string local_148 [55];
  allocator<char> local_111;
  strfmt<200> local_110;
  string local_40 [47];
  byte local_11;
  
  local_11 = in_DL & 1;
  bVar1 = std::operator!=((shared_ptr<std::exception> *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe18);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bd222);
    this_00 = &local_110;
    strfmt<200>::strfmt(this_00,"failed to create a snapshot due to %s");
    peVar2 = std::__shared_ptr_access<std::exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<std::exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd24d);
    (**(code **)(*(long *)peVar2 + 0x10))();
    strfmt<200>::fmt<char_const*>(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)peVar3,in_stack_fffffffffffffe50);
    (*peVar3->_vptr_logger[5])(peVar3,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_111);
  }
  else if ((local_11 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bd335);
    __a = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,__a);
    (*peVar3->_vptr_logger[3])(peVar3,local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe38 =
         std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1bd411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    (*in_stack_fffffffffffffe38->_vptr_logger[2])(in_stack_fffffffffffffe38,local_178);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    std::shared_ptr<cornerstone::snapshot>::operator=
              ((shared_ptr<cornerstone::snapshot> *)in_stack_fffffffffffffe20,
               (shared_ptr<cornerstone::snapshot> *)in_stack_fffffffffffffe18);
    peVar4 = std::
             __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd48c);
    in_stack_fffffffffffffe30 = snapshot::get_last_log_idx(peVar4);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1bd4a9);
    prVar5 = std::
             unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>::
             operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                         *)0x1bd4b5);
    if ((ulong)(long)prVar5->reserved_log_items_ < in_stack_fffffffffffffe30) {
      peVar6 = std::
               __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1bd4db);
      peVar4 = std::
               __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1bd4ed);
      uVar7 = snapshot::get_last_log_idx(peVar4);
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1bd50a);
      prVar5 = std::
               unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
               ::operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                             *)0x1bd516);
      (*peVar6->_vptr_log_store[0xc])(peVar6,uVar7 - (long)prVar5->reserved_log_items_);
    }
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1bd597)
    ;
  }
  std::atomic<bool>::store
            ((atomic<bool> *)in_stack_fffffffffffffe38,SUB81(in_stack_fffffffffffffe30 >> 0x38,0),
             (memory_order)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void raft_server::on_snapshot_completed(ptr<snapshot>& s, bool result, const ptr<std::exception>& err)
{
    do
    {
        if (err != nilptr)
        {
            l_->err(lstrfmt("failed to create a snapshot due to %s").fmt(err->what()));
            break;
        }

        if (!result)
        {
            l_->info("the state machine rejects to create the snapshot");
            break;
        }

        {
            recur_lock(lock_);
            l_->debug("snapshot created, compact the log store");

            last_snapshot_ = s;
            if (s->get_last_log_idx() > (ulong)ctx_->params_->reserved_log_items_)
            {
                log_store_->compact(s->get_last_log_idx() - (ulong)ctx_->params_->reserved_log_items_);
            }
        }
    } while (false);
    snp_in_progress_.store(false);
}